

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::SSLTest_SigAlgs_Test::TestBody(SSLTest_SigAlgs_Test *this)

{
  allocator<unsigned_short> *this_00;
  initializer_list<unsigned_short> __l;
  initializer_list<int> __l_00;
  initializer_list<unsigned_short> __l_01;
  initializer_list<int> __l_02;
  initializer_list<unsigned_short> __l_03;
  initializer_list<int> __l_04;
  initializer_list<unsigned_short> __l_05;
  initializer_list<int> __l_06;
  initializer_list<unsigned_short> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  pointer psVar3;
  char *pcVar4;
  int *values;
  size_type num_values;
  pointer pCVar5;
  pointer psVar6;
  char *in_R9;
  Span<const_unsigned_short> local_288;
  Span<const_unsigned_short> local_278;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  uint local_240;
  bool ok;
  anon_struct_56_3_5277038f *paStack_238;
  ScopedTrace gtest_trace_6324;
  anon_struct_56_3_5277038f *test;
  anon_struct_56_3_5277038f *__end2;
  anon_struct_56_3_5277038f *__begin2;
  anon_struct_56_3_5277038f (*__range2) [10];
  uint n;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  allocator<int> local_1a9;
  int local_1a8 [4];
  iterator local_198;
  size_type local_190;
  undefined1 local_184;
  allocator<unsigned_short> local_183;
  unsigned_short local_182;
  iterator local_180;
  size_type local_178;
  allocator<int> local_169;
  int local_168 [2];
  iterator local_160;
  size_type local_158;
  undefined1 local_14c;
  allocator<unsigned_short> local_14b;
  unsigned_short local_14a;
  iterator local_148;
  size_type local_140;
  allocator<int> local_131;
  int local_130 [2];
  iterator local_128;
  size_type local_120;
  undefined1 local_114;
  allocator<unsigned_short> local_113;
  unsigned_short local_112;
  iterator local_110;
  size_type local_108;
  allocator<int> local_f9;
  int local_f8 [2];
  iterator local_f0;
  size_type local_e8;
  undefined1 local_dc;
  allocator<unsigned_short> local_db;
  unsigned_short local_da;
  iterator local_d8;
  size_type local_d0;
  allocator<int> local_c1;
  int local_c0 [2];
  iterator local_b8;
  size_type local_b0;
  allocator<int> local_a1;
  int local_a0 [4];
  iterator local_90;
  size_type local_88;
  allocator<int> local_79;
  int local_78 [2];
  iterator local_70;
  size_type local_68;
  allocator<int> local_5d;
  int local_5c [3];
  iterator local_50;
  size_type local_48;
  allocator<int> local_2d;
  int local_2c;
  iterator local_28;
  size_type local_20;
  anon_struct_56_3_5277038f *local_18;
  SSLTest_SigAlgs_Test *local_10;
  SSLTest_SigAlgs_Test *this_local;
  
  local_10 = this;
  if (((anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests),
     iVar2 != 0)) {
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._1_1_ = 1;
    local_18 = TestBody::kTests;
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[0].input);
    TestBody::kTests[0].ok = true;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[0].expected);
    local_18 = (anon_struct_56_3_5277038f *)0x65d6b8;
    local_2c = 1;
    local_28 = &local_2c;
    local_20 = 1;
    std::allocator<int>::allocator(&local_2d);
    __l_12._M_len = local_20;
    __l_12._M_array = local_28;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[1].input,__l_12,&local_2d);
    TestBody::kTests[1].ok = false;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[1].expected);
    local_18 = (anon_struct_56_3_5277038f *)0x65d6f0;
    local_5c[0] = 1;
    local_5c[1] = 2;
    local_5c[2] = 3;
    local_50 = local_5c;
    local_48 = 3;
    std::allocator<int>::allocator(&local_5d);
    __l_11._M_len = local_48;
    __l_11._M_array = local_50;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[2].input,__l_11,&local_5d);
    TestBody::kTests[2].ok = false;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[2].expected);
    local_18 = (anon_struct_56_3_5277038f *)0x65d728;
    local_78[0] = 0x2a0;
    local_78[1] = 0x3b5;
    local_70 = local_78;
    local_68 = 2;
    std::allocator<int>::allocator(&local_79);
    __l_10._M_len = local_68;
    __l_10._M_array = local_70;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[3].input,__l_10,&local_79);
    TestBody::kTests[3].ok = false;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[3].expected);
    local_18 = (anon_struct_56_3_5277038f *)0x65d760;
    local_a0[0] = 0x2a0;
    local_a0[1] = 6;
    local_a0[2] = 0x2a0;
    local_a0[3] = 6;
    local_90 = local_a0;
    local_88 = 4;
    std::allocator<int>::allocator(&local_a1);
    __l_09._M_len = local_88;
    __l_09._M_array = local_90;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[4].input,__l_09,&local_a1);
    TestBody::kTests[4].ok = false;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[4].expected);
    local_18 = (anon_struct_56_3_5277038f *)0x65d798;
    local_c0[0] = 0x2a0;
    local_c0[1] = 6;
    local_b8 = local_c0;
    local_b0 = 2;
    std::allocator<int>::allocator(&local_c1);
    __l_08._M_len = local_b0;
    __l_08._M_array = local_b8;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[5].input,__l_08,&local_c1);
    local_dc = 1;
    TestBody::kTests[5].ok = true;
    local_da = 0x401;
    local_d8 = &local_da;
    local_d0 = 1;
    std::allocator<unsigned_short>::allocator(&local_db);
    __l_07._M_len = local_d0;
    __l_07._M_array = local_d8;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[5].expected,__l_07,&local_db);
    local_dc = 0;
    local_18 = (anon_struct_56_3_5277038f *)0x65d7d0;
    local_f8[0] = 0x2a2;
    local_f8[1] = 6;
    local_f0 = local_f8;
    local_e8 = 2;
    std::allocator<int>::allocator(&local_f9);
    __l_06._M_len = local_e8;
    __l_06._M_array = local_f0;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[6].input,__l_06,&local_f9);
    local_114 = 1;
    TestBody::kTests[6].ok = true;
    local_112 = 0x601;
    local_110 = &local_112;
    local_108 = 1;
    std::allocator<unsigned_short>::allocator(&local_113);
    __l_05._M_len = local_108;
    __l_05._M_array = local_110;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[6].expected,__l_05,&local_113);
    local_114 = 0;
    local_18 = (anon_struct_56_3_5277038f *)0x65d808;
    local_130[0] = 0x2a0;
    local_130[1] = 0x390;
    local_128 = local_130;
    local_120 = 2;
    std::allocator<int>::allocator(&local_131);
    __l_04._M_len = local_120;
    __l_04._M_array = local_128;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[7].input,__l_04,&local_131);
    local_14c = 1;
    TestBody::kTests[7].ok = true;
    local_14a = 0x804;
    local_148 = &local_14a;
    local_140 = 1;
    std::allocator<unsigned_short>::allocator(&local_14b);
    __l_03._M_len = local_140;
    __l_03._M_array = local_148;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[7].expected,__l_03,&local_14b);
    local_14c = 0;
    local_18 = (anon_struct_56_3_5277038f *)0x65d840;
    local_168[0] = 0;
    local_168[1] = 0x3b5;
    local_160 = local_168;
    local_158 = 2;
    std::allocator<int>::allocator(&local_169);
    __l_02._M_len = local_158;
    __l_02._M_array = local_160;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[8].input,__l_02,&local_169);
    local_184 = 1;
    TestBody::kTests[8].ok = true;
    local_182 = 0x807;
    local_180 = &local_182;
    local_178 = 1;
    std::allocator<unsigned_short>::allocator(&local_183);
    __l_01._M_len = local_178;
    __l_01._M_array = local_180;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[8].expected,__l_01,&local_183);
    local_184 = 0;
    local_18 = (anon_struct_56_3_5277038f *)0x65d878;
    local_1a8[0] = 0;
    local_1a8[1] = 0x3b5;
    local_1a8[2] = 0x2a1;
    local_1a8[3] = 0x198;
    local_198 = local_1a8;
    local_190 = 4;
    std::allocator<int>::allocator(&local_1a9);
    __l_00._M_len = local_190;
    __l_00._M_array = local_198;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[9].input,__l_00,&local_1a9);
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._2_1_ = 1;
    TestBody::kTests[9].ok = true;
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._4_2_ = 0x807;
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._6_2_ = 0x503;
    this_00 = (allocator<unsigned_short> *)
              ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 3);
    std::allocator<unsigned_short>::allocator(this_00);
    __l._M_len = 2;
    __l._M_array = (iterator)
                   ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 4);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[9].expected,__l,this_00);
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._2_1_ = 0;
    ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._1_1_ = 0;
    std::allocator<unsigned_short>::~allocator
              ((allocator<unsigned_short> *)
               ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 3));
    std::allocator<int>::~allocator(&local_1a9);
    std::allocator<unsigned_short>::~allocator(&local_183);
    std::allocator<int>::~allocator(&local_169);
    std::allocator<unsigned_short>::~allocator(&local_14b);
    std::allocator<int>::~allocator(&local_131);
    std::allocator<unsigned_short>::~allocator(&local_113);
    std::allocator<int>::~allocator(&local_f9);
    std::allocator<unsigned_short>::~allocator(&local_db);
    std::allocator<int>::~allocator(&local_c1);
    std::allocator<int>::~allocator(&local_a1);
    std::allocator<int>::~allocator(&local_79);
    std::allocator<int>::~allocator(&local_5d);
    std::allocator<int>::~allocator(&local_2d);
    __cxa_atexit(__cxx_global_array_dtor_1238,0,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests);
  }
  meth = (SSL_METHOD *)TLS_method();
  psVar3 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_1e0,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&n,(internal *)local_1e0,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x18b0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&n);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  if (bVar1) {
    __range2._0_4_ = 1;
    for (__end2 = TestBody::kTests;
        __end2 != (anon_struct_56_3_5277038f *)
                  &(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests;
        __end2 = __end2 + 1) {
      paStack_238 = __end2;
      local_240 = (uint)__range2;
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                ((ScopedTrace *)&ok,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x18b4,&local_240);
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      values = std::vector<int,_std::allocator<int>_>::data(&paStack_238->input);
      num_values = std::vector<int,_std::allocator<int>_>::size(&paStack_238->input);
      iVar2 = SSL_CTX_set1_sigalgs(psVar3,values,num_values);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = iVar2 != 0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                ((EqHelper *)local_258,"ok","test.ok",
                 (bool *)((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),&paStack_238->ok);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
        testing::internal::AssertHelper::AssertHelper
                  (&local_268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x18b8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_268,&local_260);
        testing::internal::AssertHelper::~AssertHelper(&local_268);
        testing::Message::~Message(&local_260);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
      if ((gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._7_1_ & 1) == 0) {
        ERR_clear_error();
      }
      if ((paStack_238->ok & 1U) != 0) {
        Span<unsigned_short_const>::
        Span<std::vector<unsigned_short,std::allocator<unsigned_short>>,void,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                  ((Span<unsigned_short_const> *)&local_278,&paStack_238->expected);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pCVar5 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&psVar3->cert);
        psVar6 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                           (&pCVar5->legacy_credential);
        Span<unsigned_short_const>::
        Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
                  ((Span<unsigned_short_const> *)&local_288,&psVar6->sigalgs);
        ExpectSigAlgsEqual(local_278,local_288);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&ok);
      __range2._0_4_ = (uint)__range2 + 1;
    }
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, SigAlgs) {
  static const struct {
    std::vector<int> input;
    bool ok;
    std::vector<uint16_t> expected;
  } kTests[] = {
      {{}, true, {}},
      {{1}, false, {}},
      {{1, 2, 3}, false, {}},
      {{NID_sha256, EVP_PKEY_ED25519}, false, {}},
      {{NID_sha256, EVP_PKEY_RSA, NID_sha256, EVP_PKEY_RSA}, false, {}},

      {{NID_sha256, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA256}},
      {{NID_sha512, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA512}},
      {{NID_sha256, EVP_PKEY_RSA_PSS}, true, {SSL_SIGN_RSA_PSS_RSAE_SHA256}},
      {{NID_undef, EVP_PKEY_ED25519}, true, {SSL_SIGN_ED25519}},
      {{NID_undef, EVP_PKEY_ED25519, NID_sha384, EVP_PKEY_EC},
       true,
       {SSL_SIGN_ED25519, SSL_SIGN_ECDSA_SECP384R1_SHA384}},
  };

  UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  unsigned n = 1;
  for (const auto &test : kTests) {
    SCOPED_TRACE(n++);

    const bool ok =
        SSL_CTX_set1_sigalgs(ctx.get(), test.input.data(), test.input.size());
    EXPECT_EQ(ok, test.ok);

    if (!ok) {
      ERR_clear_error();
    }

    if (!test.ok) {
      continue;
    }

    ExpectSigAlgsEqual(test.expected, ctx->cert->legacy_credential->sigalgs);
  }
}